

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

VoidPromiseAndPipeline * __thiscall
capnp::anon_unknown_0::MembraneHook::call
          (VoidPromiseAndPipeline *__return_storage_ptr__,MembraneHook *this,uint64_t interfaceId,
          uint16_t methodId,Own<capnp::CallContextHook> *context)

{
  PipelineHook **this_00;
  ClientHook *pCVar1;
  Own<capnp::CallContextHook> *pOVar2;
  MembranePolicy *pMVar3;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *other;
  Promise<kj::Own<capnp::ClientHook>_> *pPVar4;
  Own<capnp::ClientHook> *attachments;
  Client *pCVar5;
  NullableValue<kj::Promise<void>_> *other_00;
  Promise<void> *pPVar6;
  Own<capnp::PipelineHook> *params;
  Own<capnp::MembranePolicy> local_1f8;
  Own<capnp::(anonymous_namespace)::MembranePipelineHook> local_1e8;
  Promise<void> local_1d8;
  Maybe<kj::Promise<void>_> local_1c8;
  undefined1 local_1b0 [8];
  NullableValue<kj::Promise<void>_> r_2;
  Own<capnp::MembranePolicy> local_190;
  Own<capnp::(anonymous_namespace)::MembraneCallContextHook> local_180;
  Own<capnp::CallContextHook> local_170;
  undefined1 local_160 [8];
  VoidPromiseAndPipeline result;
  Own<capnp::ClientHook> local_130;
  uint local_11c;
  undefined1 local_118 [16];
  Promise<kj::Own<capnp::ClientHook>_> local_108;
  Own<capnp::ClientHook> local_f8;
  Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> local_e8;
  undefined1 local_d0 [8];
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> p;
  Client *r_1;
  Own<capnp::ClientHook> local_a8;
  Client local_98;
  byte local_85;
  byte local_71;
  Own<capnp::ClientHook> local_70;
  Client local_60;
  undefined1 local_50 [8];
  Maybe<capnp::Capability::Client> redirect;
  Own<capnp::ClientHook> *r;
  Own<capnp::CallContextHook> *context_local;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  MembraneHook *this_local;
  
  redirect.ptr.field_1.value.hook.ptr =
       (ClientHook *)kj::_::readMaybe<capnp::ClientHook>(&this->resolved);
  if ((Own<capnp::ClientHook> *)redirect.ptr.field_1.value.hook.ptr == (Own<capnp::ClientHook> *)0x0
     ) {
    local_71 = 0;
    local_85 = 0;
    if ((this->reverse & 1U) == 0) {
      pMVar3 = kj::Own<capnp::MembranePolicy>::operator->(&this->policy);
      pCVar1 = kj::Own<capnp::ClientHook>::operator->(&this->inner);
      (*pCVar1->_vptr_ClientHook[4])(&local_a8);
      Capability::Client::Client(&local_98,&local_a8);
      (**pMVar3->_vptr_MembranePolicy)(local_50,pMVar3,interfaceId,(ulong)methodId,&local_98);
      Capability::Client::~Client(&local_98);
      kj::Own<capnp::ClientHook>::~Own(&local_a8);
    }
    else {
      pMVar3 = kj::Own<capnp::MembranePolicy>::operator->(&this->policy);
      pCVar1 = kj::Own<capnp::ClientHook>::operator->(&this->inner);
      (*pCVar1->_vptr_ClientHook[4])();
      local_71 = 1;
      Capability::Client::Client(&local_60,&local_70);
      local_85 = 1;
      (*pMVar3->_vptr_MembranePolicy[1])(local_50,pMVar3,interfaceId,(ulong)methodId,&local_60);
    }
    if ((local_85 & 1) != 0) {
      Capability::Client::~Client(&local_60);
    }
    if ((local_71 & 1) != 0) {
      kj::Own<capnp::ClientHook>::~Own(&local_70);
    }
    p.field_1.value.super_PromiseBase.node.ptr =
         (PromiseNode *)
         kj::_::readMaybe<capnp::Capability::Client>((Maybe<capnp::Capability::Client> *)local_50);
    if ((Client *)p.field_1.value.super_PromiseBase.node.ptr == (Client *)0x0) {
      pCVar1 = kj::Own<capnp::ClientHook>::operator->(&this->inner);
      pOVar2 = kj::mv<kj::Own<capnp::CallContextHook>>(context);
      pMVar3 = kj::Own<capnp::MembranePolicy>::operator->(&this->policy);
      (*pMVar3->_vptr_MembranePolicy[2])(&local_190);
      r_2.field_1._15_1_ = ~this->reverse & 1;
      kj::
      refcounted<capnp::(anonymous_namespace)::MembraneCallContextHook,kj::Own<capnp::CallContextHook>,kj::Own<capnp::MembranePolicy>,bool>
                ((kj *)&local_180,pOVar2,&local_190,(bool *)((long)&r_2.field_1 + 0xf));
      kj::Own<capnp::CallContextHook>::
      Own<capnp::(anonymous_namespace)::MembraneCallContextHook,void>(&local_170,&local_180);
      (*pCVar1->_vptr_ClientHook[1])(local_160,pCVar1,interfaceId,(ulong)methodId,&local_170);
      kj::Own<capnp::CallContextHook>::~Own(&local_170);
      kj::Own<capnp::(anonymous_namespace)::MembraneCallContextHook>::~Own(&local_180);
      kj::Own<capnp::MembranePolicy>::~Own(&local_190);
      pMVar3 = kj::Own<capnp::MembranePolicy>::operator->(&this->policy);
      (*pMVar3->_vptr_MembranePolicy[3])(&local_1c8);
      other_00 = kj::_::readMaybe<kj::Promise<void>>(&local_1c8);
      kj::_::NullableValue<kj::Promise<void>_>::NullableValue
                ((NullableValue<kj::Promise<void>_> *)local_1b0,other_00);
      kj::Maybe<kj::Promise<void>_>::~Maybe(&local_1c8);
      pPVar6 = kj::_::NullableValue::operator_cast_to_Promise_((NullableValue *)local_1b0);
      if (pPVar6 != (Promise<void> *)0x0) {
        pPVar6 = kj::_::NullableValue<kj::Promise<void>_>::operator*
                           ((NullableValue<kj::Promise<void>_> *)local_1b0);
        kj::mv<kj::Promise<void>>(pPVar6);
        kj::Promise<void>::exclusiveJoin(&local_1d8,(Promise<void> *)local_160);
        kj::Promise<void>::operator=((Promise<void> *)local_160,&local_1d8);
        kj::Promise<void>::~Promise(&local_1d8);
      }
      kj::_::NullableValue<kj::Promise<void>_>::~NullableValue
                ((NullableValue<kj::Promise<void>_> *)local_1b0);
      pPVar6 = kj::mv<kj::Promise<void>>((Promise<void> *)local_160);
      kj::Promise<void>::Promise(&__return_storage_ptr__->promise,pPVar6);
      params = kj::mv<kj::Own<capnp::PipelineHook>>
                         ((Own<capnp::PipelineHook> *)&result.promise.super_PromiseBase.node.ptr);
      pMVar3 = kj::Own<capnp::MembranePolicy>::operator->(&this->policy);
      (*pMVar3->_vptr_MembranePolicy[2])(&local_1f8);
      kj::
      refcounted<capnp::(anonymous_namespace)::MembranePipelineHook,kj::Own<capnp::PipelineHook>,kj::Own<capnp::MembranePolicy>,bool&>
                ((kj *)&local_1e8,params,&local_1f8,&this->reverse);
      kj::Own<capnp::PipelineHook>::Own<capnp::(anonymous_namespace)::MembranePipelineHook,void>
                (&__return_storage_ptr__->pipeline,&local_1e8);
      kj::Own<capnp::(anonymous_namespace)::MembranePipelineHook>::~Own(&local_1e8);
      kj::Own<capnp::MembranePolicy>::~Own(&local_1f8);
      local_11c = 1;
      ClientHook::VoidPromiseAndPipeline::~VoidPromiseAndPipeline
                ((VoidPromiseAndPipeline *)local_160);
    }
    else {
      whenMoreResolved(&local_e8,this);
      other = kj::_::readMaybe<kj::Promise<kj::Own<capnp::ClientHook>>>(&local_e8);
      kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::NullableValue
                ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)local_d0,other);
      kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_>::~Maybe(&local_e8);
      pPVar4 = kj::_::NullableValue::operator_cast_to_Promise_((NullableValue *)local_d0);
      if (pPVar4 != (Promise<kj::Own<capnp::ClientHook>_> *)0x0) {
        attachments = (Own<capnp::ClientHook> *)
                      kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::operator->
                                ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)
                                 local_d0);
        addRef((MembraneHook *)local_118);
        kj::Promise<kj::Own<capnp::ClientHook>>::attach<kj::Own<capnp::ClientHook>>
                  ((Promise<kj::Own<capnp::ClientHook>> *)&local_108,attachments);
        newLocalPromiseClient((capnp *)&local_f8,&local_108);
        pCVar1 = kj::Own<capnp::ClientHook>::operator->(&local_f8);
        pOVar2 = kj::mv<kj::Own<capnp::CallContextHook>>(context);
        (*pCVar1->_vptr_ClientHook[1])
                  (__return_storage_ptr__,pCVar1,interfaceId,(ulong)methodId,pOVar2);
        kj::Own<capnp::ClientHook>::~Own(&local_f8);
        kj::Promise<kj::Own<capnp::ClientHook>_>::~Promise(&local_108);
        kj::Own<capnp::ClientHook>::~Own((Own<capnp::ClientHook> *)local_118);
      }
      local_11c = (uint)(pPVar4 != (Promise<kj::Own<capnp::ClientHook>_> *)0x0);
      kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::~NullableValue
                ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)local_d0);
      if (local_11c == 0) {
        pCVar5 = kj::mv<capnp::Capability::Client>
                           ((Client *)p.field_1.value.super_PromiseBase.node.ptr);
        this_00 = &result.pipeline.ptr;
        Capability::Client::Client((Client *)this_00,pCVar5);
        ClientHook::from((ClientHook *)&local_130,(Client *)this_00);
        pCVar1 = kj::Own<capnp::ClientHook>::operator->(&local_130);
        pOVar2 = kj::mv<kj::Own<capnp::CallContextHook>>(context);
        (*pCVar1->_vptr_ClientHook[1])
                  (__return_storage_ptr__,pCVar1,interfaceId,(ulong)methodId,pOVar2);
        kj::Own<capnp::ClientHook>::~Own(&local_130);
        Capability::Client::~Client((Client *)&result.pipeline.ptr);
        local_11c = 1;
      }
    }
    kj::Maybe<capnp::Capability::Client>::~Maybe((Maybe<capnp::Capability::Client> *)local_50);
  }
  else {
    pCVar1 = kj::Own<capnp::ClientHook>::get
                       ((Own<capnp::ClientHook> *)redirect.ptr.field_1.value.hook.ptr);
    pOVar2 = kj::mv<kj::Own<capnp::CallContextHook>>(context);
    (*pCVar1->_vptr_ClientHook[1])(__return_storage_ptr__,pCVar1,interfaceId,(ulong)methodId,pOVar2)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

KJ_IF_MAYBE(r, resolved) {
      return r->get()->call(interfaceId, methodId, kj::mv(context));
    }